

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O2

void m256v_LU_invmult(m256v *LU,int rank,int *rowperm,int *colperm,m256v *Y,m256v *X_out)

{
  int r;
  uint8_t alpha;
  ulong uVar1;
  int j_1;
  ulong uVar2;
  long lVar3;
  int j;
  long lVar4;
  ulong uVar5;
  
  if (rank == -1) {
    rank = LU->n_row;
    if (LU->n_col < LU->n_row) {
      rank = LU->n_col;
    }
  }
  lVar3 = (long)rank;
  for (lVar4 = lVar3; lVar4 < X_out->n_row; lVar4 = lVar4 + 1) {
    m256v_clear_row(X_out,colperm[lVar4]);
  }
  uVar2 = 0;
  uVar1 = 0;
  if (0 < rank) {
    uVar1 = (ulong)(uint)rank;
  }
  for (; uVar2 != uVar1; uVar2 = uVar2 + 1) {
    m256v_copy_row(Y,rowperm[uVar2],X_out,colperm[uVar2]);
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      m256v_multadd_row(X_out,colperm[uVar5],LU->e[uVar5 + LU->rstride * uVar2],X_out,colperm[uVar2]
                       );
    }
  }
  uVar1 = (ulong)(uint)rank;
  lVar4 = lVar3;
  while (lVar4 = lVar4 + -1, 0 < lVar3) {
    lVar3 = lVar3 + -1;
    uVar2 = uVar1 - 1;
    for (; (int)uVar1 < LU->n_col; uVar1 = uVar1 + 1) {
      m256v_multadd_row(X_out,colperm[uVar1],LU->e[uVar1 + LU->rstride * lVar4],X_out,colperm[lVar3]
                       );
    }
    r = colperm[lVar3];
    alpha = gf256_inv(LU->e[lVar3 + LU->rstride * lVar3]);
    m256v_mult_row(X_out,r,alpha);
    uVar1 = uVar2;
  }
  return;
}

Assistant:

void MV_GEN_N(_LU_invmult)(const MV_GEN_TYPE* LU,
			int rank,
			const int* rowperm,
			const int* colperm,
			const MV_GEN_TYPE* Y,
			MV_GEN_TYPE* X_out)
{
	/* Check dimensions */
	assert(LU->n_col == X_out->n_row);
	assert(LU->n_row == Y->n_row);
	assert(X_out->n_col == Y->n_col);

	/* If the rank is unspecified (-1), we assume the max rank */
	if (rank == -1)
		rank = (LU->n_col < LU->n_row ? LU->n_col : LU->n_row);

	/* Clear out the unused rows in the target vector */
	for (int i = rank; i < X_out->n_row; ++i) {
		MV_GEN_N(_clear_row)(X_out, colperm[i]);
	}

	/* Multiply with L^-1 */
	for (int i = 0; i < rank; ++i) {
		MV_GEN_N(_copy_row)(Y, rowperm[i], X_out, colperm[i]);
		for (int j = 0; j < i; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
					MV_GEN_N(_get_el)(LU, i, j),
					X_out, colperm[i]);
		}
	}

	/* Multiply with U^-1 */
	for (int i = rank - 1; i >= 0; --i) {
		for (int j = i + 1; j < LU->n_col; ++j) {
			MV_GEN_N(_multadd_row)(X_out, colperm[j],
			  MV_GEN_N(_get_el)(LU, i, j), X_out, colperm[i]);
		}
		MV_GEN_N(_mult_row)(X_out, colperm[i],
				finv(MV_GEN_N(_get_el)(LU, i, i)));
	}
}